

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O0

void brotli::HistogramReindex<brotli::Histogram<704>>
               (vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *symbols)

{
  mapped_type_conflict mVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  mapped_type_conflict *pmVar6;
  reference __src;
  reference __dest;
  ulong local_98;
  size_t i_1;
  _Self local_78;
  ulong local_70;
  size_t i;
  undefined1 local_60 [4];
  uint32_t next_index;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  new_index;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *symbols_local;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *out_local;
  
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::vector
            ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)
             &new_index._M_t._M_impl.super__Rb_tree_header._M_node_count,out);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         *)local_60);
  i._4_4_ = 0;
  for (local_70 = 0; uVar2 = local_70,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(symbols), uVar2 < sVar4
      ; local_70 = local_70 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](symbols,local_70);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)local_60,pvVar5);
    i_1 = (size_t)std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)local_60);
    bVar3 = std::operator==(&local_78,(_Self *)&i_1);
    mVar1 = i._4_4_;
    if (bVar3) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (symbols,local_70);
      pmVar6 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)local_60,pvVar5);
      *pmVar6 = mVar1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (symbols,local_70);
      __src = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
              operator[]((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *
                         )&new_index._M_t._M_impl.super__Rb_tree_header._M_node_count,(ulong)*pvVar5
                        );
      __dest = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
               operator[](out,(ulong)i._4_4_);
      memcpy(__dest,__src,0xb10);
      i._4_4_ = i._4_4_ + 1;
    }
  }
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
            (out,(ulong)i._4_4_);
  for (local_98 = 0; sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(symbols)
      , local_98 < sVar4; local_98 = local_98 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](symbols,local_98);
    pmVar6 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)local_60,pvVar5);
    mVar1 = *pmVar6;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](symbols,local_98);
    *pvVar5 = mVar1;
  }
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *)local_60);
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::~vector
            ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)
             &new_index._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void HistogramReindex(std::vector<HistogramType>* out,
                      std::vector<uint32_t>* symbols) {
  std::vector<HistogramType> tmp(*out);
  std::map<uint32_t, uint32_t> new_index;
  uint32_t next_index = 0;
  for (size_t i = 0; i < symbols->size(); ++i) {
    if (new_index.find((*symbols)[i]) == new_index.end()) {
      new_index[(*symbols)[i]] = next_index;
      (*out)[next_index] = tmp[(*symbols)[i]];
      ++next_index;
    }
  }
  out->resize(next_index);
  for (size_t i = 0; i < symbols->size(); ++i) {
    (*symbols)[i] = new_index[(*symbols)[i]];
  }
}